

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::JsonReporter::listTests
          (JsonReporter *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests)

{
  TestCaseInfo *pTVar1;
  StringRef *pSVar2;
  StringRef value;
  ios_base *this_00;
  pointer pTVar3;
  int __fd;
  _Elt_pointer pJVar4;
  Tag *tag;
  StringRef *value_00;
  StringRef key;
  JsonArrayWriter writer;
  JsonArrayWriter tag_writer;
  JsonObjectWriter desc_writer;
  char local_229;
  ios_base *local_228;
  pointer local_220;
  pointer local_218;
  JsonArrayWriter local_210;
  JsonArrayWriter local_1f8;
  JsonObjectWriter local_1e0;
  undefined1 local_1c8 [400];
  uint64_t local_38;
  
  if (this->m_startedListing == false) {
    key.m_size = 8;
    key.m_start = "listings";
    startObject(this,key);
  }
  this->m_startedListing = true;
  pJVar4 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar4 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar4 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonObjectWriter::write((JsonObjectWriter *)local_1c8,(int)pJVar4 + -0x18,"tests",5);
  local_210.m_os = (ostream *)local_1c8._0_8_;
  local_210.m_indent_level = local_38;
  local_210.m_should_comma = false;
  local_210.m_active = true;
  local_1e0.m_os._0_1_ = 0x5b;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8._0_8_,(char *)&local_1e0,1);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x88));
  pTVar3 = (tests->super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_220 = (tests->
              super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar3 != local_220) {
    local_228 = (ios_base *)(local_1c8 + 0x88);
    do {
      this_00 = local_228;
      JsonArrayWriter::writeObject(&local_1e0,&local_210);
      pTVar1 = pTVar3->m_info;
      __fd = (int)&local_1e0;
      JsonObjectWriter::write((JsonObjectWriter *)local_1c8,__fd,"name",4);
      value.m_start = (pTVar1->name)._M_dataplus._M_p;
      value.m_size = (pTVar1->name)._M_string_length;
      JsonValueWriter::writeImpl((JsonValueWriter *)local_1c8,value,true);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 8));
      std::ios_base::~ios_base(this_00);
      JsonObjectWriter::write((JsonObjectWriter *)local_1c8,__fd,"class-name",10);
      JsonValueWriter::writeImpl((JsonValueWriter *)local_1c8,pTVar1->className,true);
      local_218 = pTVar3;
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 8));
      std::ios_base::~ios_base(this_00);
      JsonObjectWriter::write((JsonObjectWriter *)local_1c8,__fd,"tags",4);
      local_1f8.m_os = (ostream *)local_1c8._0_8_;
      local_1f8.m_indent_level = local_38;
      local_1f8.m_should_comma = false;
      local_1f8.m_active = true;
      local_229 = '[';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8._0_8_,&local_229,1);
      std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 8));
      std::ios_base::~ios_base(this_00);
      pSVar2 = &((pTVar1->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
                 super__Vector_impl_data._M_finish)->original;
      for (value_00 = &((pTVar1->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                        _M_impl.super__Vector_impl_data._M_start)->original; value_00 != pSVar2;
          value_00 = value_00 + 1) {
        JsonArrayWriter::writeImpl<Catch::StringRef>(&local_1f8,value_00);
      }
      JsonArrayWriter::~JsonArrayWriter(&local_1f8);
      anon_unknown_26::writeSourceInfo(&local_1e0,&pTVar1->lineInfo);
      JsonObjectWriter::~JsonObjectWriter(&local_1e0);
      pTVar3 = local_218 + 1;
    } while (pTVar3 != local_220);
  }
  JsonArrayWriter::~JsonArrayWriter(&local_210);
  return;
}

Assistant:

void JsonReporter::listTests( std::vector<TestCaseHandle> const& tests ) {
        startListing();

        auto writer = m_objectWriters.top().write( "tests"_sr ).writeArray();

        for ( auto const& test : tests ) {
            auto desc_writer = writer.writeObject();
            auto const& info = test.getTestCaseInfo();

            desc_writer.write( "name"_sr ).write( info.name );
            desc_writer.write( "class-name"_sr ).write( info.className );
            {
                auto tag_writer = desc_writer.write( "tags"_sr ).writeArray();
                for ( auto const& tag : info.tags ) {
                    tag_writer.write( tag.original );
                }
            }
            writeSourceInfo( desc_writer, info.lineInfo );
        }
    }